

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqHelper.cpp
# Opt level: O2

VirtualIterator<Kernel::Term_*> __thiscall
Kernel::EqHelper::getRewritableSubtermIterator<Kernel::NonVariableNonTypeIterator>
          (EqHelper *this,Literal *lit,Ordering *ord)

{
  int *piVar1;
  Term *term;
  Result RVar2;
  TermList *pTVar3;
  NonVariableNonTypeIterator *this_00;
  VirtualIterator<Kernel::Term_*> local_58;
  NonVariableNonTypeIterator si;
  
  if ((lit->super_Term)._functor != 0) {
    NonVariableNonTypeIterator::NonVariableNonTypeIterator(&si,&lit->super_Term,false);
    Lib::getUniquePersistentIteratorFromPtr<Kernel::NonVariableNonTypeIterator>((Lib *)this,&si);
LAB_004239c6:
    NonVariableNonTypeIterator::~NonVariableNonTypeIterator(&si);
    return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
  }
  RVar2 = Ordering::getEqualityArgumentOrder(ord,lit);
  switch(RVar2) {
  case GREATER:
  case EQUAL:
    pTVar3 = (lit->super_Term)._args + (*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
    break;
  case LESS:
    pTVar3 = (lit->super_Term)._args +
             ((ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff) - 1);
    break;
  case INCOMPARABLE:
    NonVariableNonTypeIterator::NonVariableNonTypeIterator(&si,&lit->super_Term,false);
    Lib::getUniquePersistentIteratorFromPtr<Kernel::NonVariableNonTypeIterator>((Lib *)this,&si);
    goto LAB_004239c6;
  default:
    goto switchD_004239f5_default;
  }
  term = (Term *)pTVar3->_content;
  if (((ulong)term & 3) == 0) {
    this_00 = (NonVariableNonTypeIterator *)::operator_new(0x38);
    NonVariableNonTypeIterator::NonVariableNonTypeIterator(this_00,term,true);
    piVar1 = &(this_00->super_IteratorCore<Kernel::Term_*>)._refCnt;
    *piVar1 = *piVar1 + 1;
    local_58._core = (IteratorCore<Kernel::Term_*> *)this_00;
    Lib::getUniquePersistentIterator<Lib::VirtualIterator<Kernel::Term*>>((Lib *)this,&local_58);
    Lib::VirtualIterator<Kernel::Term_*>::~VirtualIterator(&local_58);
  }
  else {
switchD_004239f5_default:
    Lib::VirtualIterator<Kernel::Term_*>::getEmpty();
  }
  return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
}

Assistant:

VirtualIterator<ELEMENT_TYPE(SubtermIterator)> EqHelper::getRewritableSubtermIterator(Literal* lit, const Ordering& ord)
{
  if (lit->isEquality()) {
    TermList sel;
    switch(ord.getEqualityArgumentOrder(lit)) {
    case Ordering::INCOMPARABLE: {
      SubtermIterator si(lit);
      return getUniquePersistentIteratorFromPtr(&si);
    }
    case Ordering::EQUAL:
    case Ordering::GREATER:
      sel=*lit->nthArgument(0);
      break;
    case Ordering::LESS:
      sel=*lit->nthArgument(1);
      break;
#if VDEBUG
    default:
      ASSERTION_VIOLATION;
#endif
    }
    if (!sel.isTerm()) {
      return VirtualIterator<ELEMENT_TYPE(SubtermIterator)>::getEmpty();
    }
    return getUniquePersistentIterator(vi(new SubtermIterator(sel.term(), true)));
  }

  SubtermIterator si(lit);
  return getUniquePersistentIteratorFromPtr(&si);

}